

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::getCreateSubBufferArgsString
          (CLIntercept *this,cl_buffer_create_type createType,void *createInfo,string *str)

{
  ostream *poVar1;
  char *pcVar2;
  cl_buffer_region *pRegion;
  ostringstream ss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (createType == 0x1220) {
    std::operator<<((ostream *)local_190,"region = ");
    if (createInfo != (void *)0x0) {
      poVar1 = std::operator<<((ostream *)local_190,"{ origin = ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,", size = ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1," }");
      goto LAB_0015e69d;
    }
    pcVar2 = "(NULL)";
  }
  else {
    pcVar2 = "<Unexpected!>";
  }
  std::operator<<((ostream *)local_190,pcVar2);
LAB_0015e69d:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)str,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void CLIntercept::getCreateSubBufferArgsString(
    cl_buffer_create_type createType,
    const void *createInfo,
    std::string& str ) const
{
    std::ostringstream  ss;

    switch( createType )
    {
    case CL_BUFFER_CREATE_TYPE_REGION:
        ss << "region = ";
        if( createInfo != NULL )
        {
            cl_buffer_region*   pRegion = (cl_buffer_region*)createInfo;
            ss << "{ origin = "
                << pRegion->origin
                << ", size = "
                << pRegion->size
                << " }";
        }
        else
        {
            ss << "(NULL)";
        }
        break;
    default:
        ss << "<Unexpected!>";
        break;
    }

    str = ss.str();
}